

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_traits.h
# Opt level: O3

int32_t __thiscall
charls::default_traits<unsigned_short,_unsigned_short>::modulo_range
          (default_traits<unsigned_short,_unsigned_short> *this,int32_t error_value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = -error_value;
  if (0 < error_value) {
    iVar2 = error_value;
  }
  uVar1 = this->range;
  if ((int)uVar1 < iVar2) {
    __assert_fail("std::abs(error_value) <= range",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/default_traits.h"
                  ,0x61,
                  "int32_t charls::default_traits<unsigned short, unsigned short>::modulo_range(int32_t) const [SampleType = unsigned short, PixelType = unsigned short]"
                 );
  }
  iVar2 = (error_value >> 0x1f & uVar1) + error_value;
  uVar3 = uVar1 + 1 >> 1;
  uVar4 = 0;
  if ((int)uVar3 <= iVar2) {
    uVar4 = uVar1;
  }
  iVar2 = iVar2 - uVar4;
  if ((SBORROW4(iVar2,-(uVar1 >> 1)) == (int)(iVar2 + (uVar1 >> 1)) < 0) && (iVar2 < (int)uVar3)) {
    return iVar2;
  }
  __assert_fail("-range / 2 <= error_value && error_value <= ((range + 1) / 2) - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/default_traits.h"
                ,0x6d,
                "int32_t charls::default_traits<unsigned short, unsigned short>::modulo_range(int32_t) const [SampleType = unsigned short, PixelType = unsigned short]"
               );
}

Assistant:

FORCE_INLINE int32_t modulo_range(int32_t error_value) const noexcept
    {
        ASSERT(std::abs(error_value) <= range);

        if (error_value < 0)
        {
            error_value += range;
        }

        if (error_value >= (range + 1) / 2)
        {
            error_value -= range;
        }

        ASSERT(-range / 2 <= error_value && error_value <= ((range + 1) / 2) - 1);
        return error_value;
    }